

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float *pfVar2;
  undefined8 *puVar3;
  undefined1 (*pauVar4) [16];
  float *pfVar5;
  int iVar6;
  undefined8 uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar23;
  byte bVar24;
  int iVar25;
  int iVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined1 *puVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar36;
  undefined1 *puVar37;
  ulong uVar38;
  float fVar39;
  uint uVar40;
  float fVar57;
  float fVar59;
  vint4 bi;
  uint uVar58;
  uint uVar60;
  float fVar62;
  uint uVar63;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar61;
  float fVar64;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar56;
  float fVar65;
  int iVar74;
  int iVar77;
  vint4 bi_1;
  float fVar66;
  float fVar75;
  float fVar76;
  int iVar78;
  float fVar79;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar80;
  float fVar87;
  float fVar89;
  vint4 ai;
  uint uVar81;
  uint uVar88;
  uint uVar90;
  float fVar91;
  uint uVar92;
  undefined1 auVar82 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar93;
  float fVar100;
  float fVar101;
  vint4 ai_1;
  StackItemT<embree::NodeRefPtr<4>_> SVar94;
  float fVar102;
  undefined1 auVar95 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar103;
  float fVar110;
  float fVar111;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar112;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar126;
  float fVar127;
  undefined1 auVar125 [16];
  float fVar128;
  float fVar129;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar130 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar158 [16];
  int iVar162;
  int iVar163;
  int iVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 local_12d8 [8];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c4;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  float fStack_1294;
  vbool<4> valid;
  undefined1 local_1278 [8];
  float fStack_1270;
  float fStack_126c;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined1 local_1228 [16];
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  undefined8 local_1208;
  float fStack_1200;
  float fStack_11fc;
  RTCFilterFunctionNArguments args;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  vfloat<4> tNear;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  float local_1108 [4];
  float local_10f8 [4];
  undefined1 local_10e8 [16];
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined1 local_10c8 [16];
  int local_10b8;
  int iStack_10b4;
  int iStack_10b0;
  int iStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [8];
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined4 local_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 local_1048;
  undefined4 uStack_1044;
  undefined4 uStack_1040;
  undefined4 uStack_103c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  uint local_1018;
  uint uStack_1014;
  uint uStack_1010;
  uint uStack_100c;
  uint local_1008;
  uint uStack_1004;
  uint uStack_1000;
  uint uStack_ffc;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar124 [16];
  
  pSVar36 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar66 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar76 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar79 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar121 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar165 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar166 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar25 = (tray->tnear).field_0.i[k];
  iVar26 = (tray->tfar).field_0.i[k];
  puVar29 = mm_lookupmask_ps;
  local_fe8 = mm_lookupmask_ps._0_8_;
  uStack_fe0 = mm_lookupmask_ps._8_8_;
  local_ff8 = mm_lookupmask_ps._240_8_;
  uStack_ff0 = mm_lookupmask_ps._248_8_;
  local_f98 = fVar66;
  fStack_f94 = fVar66;
  fStack_f90 = fVar66;
  fStack_f8c = fVar66;
  local_fa8 = fVar76;
  fStack_fa4 = fVar76;
  fStack_fa0 = fVar76;
  fStack_f9c = fVar76;
  local_fb8 = fVar79;
  fStack_fb4 = fVar79;
  fStack_fb0 = fVar79;
  fStack_fac = fVar79;
  local_fc8 = fVar121;
  fStack_fc4 = fVar121;
  fStack_fc0 = fVar121;
  fStack_fbc = fVar121;
  local_fd8 = fVar165;
  fStack_fd4 = fVar165;
  fStack_fd0 = fVar165;
  fStack_fcc = fVar165;
  local_10a8 = fVar166;
  fStack_10a4 = fVar166;
  fStack_10a0 = fVar166;
  fStack_109c = fVar166;
  local_10b8 = iVar25;
  iStack_10b4 = iVar25;
  iStack_10b0 = iVar25;
  iStack_10ac = iVar25;
  fVar167 = fVar76;
  fVar168 = fVar76;
  fVar93 = fVar76;
  fVar100 = fVar79;
  fVar101 = fVar79;
  fVar102 = fVar79;
  fVar103 = fVar121;
  fVar110 = fVar121;
  fVar111 = fVar121;
  fVar112 = fVar166;
  fVar61 = fVar166;
  fVar64 = fVar166;
  iVar162 = iVar25;
  iVar163 = iVar25;
  iVar164 = iVar25;
  iVar74 = iVar26;
  iVar77 = iVar26;
  iVar78 = iVar26;
  fVar143 = fVar66;
  fVar146 = fVar66;
  fVar149 = fVar66;
  fVar152 = fVar165;
  fVar65 = fVar165;
  fVar75 = fVar165;
LAB_006fefb6:
  do {
    do {
      if (pSVar36 == stack) {
        return;
      }
      pSVar23 = pSVar36 + -1;
      pSVar36 = pSVar36 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar23->dist &&
             (float)pSVar23->dist != *(float *)(ray + k * 4 + 0x80));
    puVar37 = (undefined1 *)(pSVar36->ptr).ptr;
    while (((ulong)puVar37 & 8) == 0) {
      pfVar2 = (float *)(puVar37 + uVar33 + 0x20);
      fVar39 = (*pfVar2 - fVar66) * fVar121;
      fVar57 = (pfVar2[1] - fVar143) * fVar103;
      fVar59 = (pfVar2[2] - fVar146) * fVar110;
      fVar62 = (pfVar2[3] - fVar149) * fVar111;
      pfVar2 = (float *)(puVar37 + uVar35 + 0x20);
      fVar80 = (*pfVar2 - fVar76) * fVar165;
      fVar87 = (pfVar2[1] - fVar167) * fVar152;
      fVar89 = (pfVar2[2] - fVar168) * fVar65;
      fVar91 = (pfVar2[3] - fVar93) * fVar75;
      uVar81 = (uint)((int)fVar80 < (int)fVar39) * (int)fVar39 |
               (uint)((int)fVar80 >= (int)fVar39) * (int)fVar80;
      uVar88 = (uint)((int)fVar87 < (int)fVar57) * (int)fVar57 |
               (uint)((int)fVar87 >= (int)fVar57) * (int)fVar87;
      uVar90 = (uint)((int)fVar89 < (int)fVar59) * (int)fVar59 |
               (uint)((int)fVar89 >= (int)fVar59) * (int)fVar89;
      uVar92 = (uint)((int)fVar91 < (int)fVar62) * (int)fVar62 |
               (uint)((int)fVar91 >= (int)fVar62) * (int)fVar91;
      pfVar2 = (float *)(puVar37 + uVar32 + 0x20);
      fVar39 = (*pfVar2 - fVar79) * fVar166;
      fVar57 = (pfVar2[1] - fVar100) * fVar112;
      fVar59 = (pfVar2[2] - fVar101) * fVar61;
      fVar62 = (pfVar2[3] - fVar102) * fVar64;
      uVar40 = (uint)((int)fVar39 < iVar25) * iVar25 | (uint)((int)fVar39 >= iVar25) * (int)fVar39;
      uVar58 = (uint)((int)fVar57 < iVar162) * iVar162 |
               (uint)((int)fVar57 >= iVar162) * (int)fVar57;
      uVar60 = (uint)((int)fVar59 < iVar163) * iVar163 |
               (uint)((int)fVar59 >= iVar163) * (int)fVar59;
      uVar63 = (uint)((int)fVar62 < iVar164) * iVar164 |
               (uint)((int)fVar62 >= iVar164) * (int)fVar62;
      tNear.field_0.i[0] =
           ((int)uVar40 < (int)uVar81) * uVar81 | ((int)uVar40 >= (int)uVar81) * uVar40;
      tNear.field_0.i[1] =
           ((int)uVar58 < (int)uVar88) * uVar88 | ((int)uVar58 >= (int)uVar88) * uVar58;
      tNear.field_0.i[2] =
           ((int)uVar60 < (int)uVar90) * uVar90 | ((int)uVar60 >= (int)uVar90) * uVar60;
      tNear.field_0.i[3] =
           ((int)uVar63 < (int)uVar92) * uVar92 | ((int)uVar63 >= (int)uVar92) * uVar63;
      pfVar2 = (float *)(puVar37 + (uVar33 ^ 0x10) + 0x20);
      fVar39 = (*pfVar2 - fVar66) * fVar121;
      fVar57 = (pfVar2[1] - fVar143) * fVar103;
      fVar59 = (pfVar2[2] - fVar146) * fVar110;
      fVar62 = (pfVar2[3] - fVar149) * fVar111;
      pfVar2 = (float *)(puVar37 + (uVar35 ^ 0x10) + 0x20);
      fVar80 = (*pfVar2 - fVar76) * fVar165;
      fVar87 = (pfVar2[1] - fVar167) * fVar152;
      fVar89 = (pfVar2[2] - fVar168) * fVar65;
      fVar91 = (pfVar2[3] - fVar93) * fVar75;
      uVar81 = (uint)((int)fVar39 < (int)fVar80) * (int)fVar39 |
               (uint)((int)fVar39 >= (int)fVar80) * (int)fVar80;
      uVar88 = (uint)((int)fVar57 < (int)fVar87) * (int)fVar57 |
               (uint)((int)fVar57 >= (int)fVar87) * (int)fVar87;
      uVar90 = (uint)((int)fVar59 < (int)fVar89) * (int)fVar59 |
               (uint)((int)fVar59 >= (int)fVar89) * (int)fVar89;
      uVar92 = (uint)((int)fVar62 < (int)fVar91) * (int)fVar62 |
               (uint)((int)fVar62 >= (int)fVar91) * (int)fVar91;
      pfVar2 = (float *)(puVar37 + (uVar32 ^ 0x10) + 0x20);
      fVar39 = (*pfVar2 - fVar79) * fVar166;
      fVar57 = (pfVar2[1] - fVar100) * fVar112;
      fVar59 = (pfVar2[2] - fVar101) * fVar61;
      fVar62 = (pfVar2[3] - fVar102) * fVar64;
      uVar40 = (uint)(iVar26 < (int)fVar39) * iVar26 | (uint)(iVar26 >= (int)fVar39) * (int)fVar39;
      uVar58 = (uint)(iVar74 < (int)fVar57) * iVar74 | (uint)(iVar74 >= (int)fVar57) * (int)fVar57;
      uVar60 = (uint)(iVar77 < (int)fVar59) * iVar77 | (uint)(iVar77 >= (int)fVar59) * (int)fVar59;
      uVar63 = (uint)(iVar78 < (int)fVar62) * iVar78 | (uint)(iVar78 >= (int)fVar62) * (int)fVar62;
      auVar82._0_4_ =
           -(uint)((int)(((int)uVar81 < (int)uVar40) * uVar81 |
                        ((int)uVar81 >= (int)uVar40) * uVar40) < tNear.field_0.i[0]);
      auVar82._4_4_ =
           -(uint)((int)(((int)uVar88 < (int)uVar58) * uVar88 |
                        ((int)uVar88 >= (int)uVar58) * uVar58) < tNear.field_0.i[1]);
      auVar82._8_4_ =
           -(uint)((int)(((int)uVar90 < (int)uVar60) * uVar90 |
                        ((int)uVar90 >= (int)uVar60) * uVar60) < tNear.field_0.i[2]);
      auVar82._12_4_ =
           -(uint)((int)(((int)uVar92 < (int)uVar63) * uVar92 |
                        ((int)uVar92 >= (int)uVar63) * uVar63) < tNear.field_0.i[3]);
      uVar40 = movmskps((int)puVar29,auVar82);
      puVar29 = (undefined1 *)(ulong)uVar40;
      if (uVar40 == 0xf) goto LAB_006fefb6;
      bVar24 = (byte)uVar40 ^ 0xf;
      uVar38 = (ulong)puVar37 & 0xfffffffffffffff0;
      lVar34 = 0;
      if (bVar24 != 0) {
        for (; (bVar24 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
        }
      }
      puVar29 = *(undefined1 **)(uVar38 + lVar34 * 8);
      uVar40 = bVar24 - 1 & (uint)bVar24;
      puVar37 = puVar29;
      if (uVar40 != 0) {
        uVar58 = tNear.field_0.i[lVar34];
        lVar34 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
          }
        }
        puVar37 = *(undefined1 **)(uVar38 + lVar34 * 8);
        uVar60 = tNear.field_0.i[lVar34];
        uVar40 = uVar40 - 1 & uVar40;
        if (uVar40 == 0) {
          if (uVar58 < uVar60) {
            (pSVar36->ptr).ptr = (size_t)puVar37;
            pSVar36->dist = uVar60;
            pSVar36 = pSVar36 + 1;
            puVar37 = puVar29;
          }
          else {
            (pSVar36->ptr).ptr = (size_t)puVar29;
            pSVar36->dist = uVar58;
            puVar29 = puVar37;
            pSVar36 = pSVar36 + 1;
          }
        }
        else {
          auVar105._8_4_ = uVar58;
          auVar105._0_8_ = puVar29;
          auVar105._12_4_ = 0;
          auVar115._8_4_ = uVar60;
          auVar115._0_8_ = puVar37;
          auVar115._12_4_ = 0;
          lVar34 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
            }
          }
          uVar7 = *(undefined8 *)(uVar38 + lVar34 * 8);
          iVar6 = tNear.field_0.i[lVar34];
          auVar123._8_4_ = iVar6;
          auVar123._0_8_ = uVar7;
          auVar123._12_4_ = 0;
          auVar116._8_4_ = -(uint)((int)uVar58 < (int)uVar60);
          uVar40 = uVar40 - 1 & uVar40;
          if (uVar40 == 0) {
            auVar116._4_4_ = auVar116._8_4_;
            auVar116._0_4_ = auVar116._8_4_;
            auVar116._12_4_ = auVar116._8_4_;
            auVar113._8_4_ = uVar60;
            auVar113._0_8_ = puVar37;
            auVar113._12_4_ = 0;
            auVar114 = blendvps(auVar113,auVar105,auVar116);
            auVar82 = blendvps(auVar105,auVar115,auVar116);
            auVar41._8_4_ = -(uint)(auVar114._8_4_ < iVar6);
            auVar41._4_4_ = auVar41._8_4_;
            auVar41._0_4_ = auVar41._8_4_;
            auVar41._12_4_ = auVar41._8_4_;
            auVar104._8_4_ = iVar6;
            auVar104._0_8_ = uVar7;
            auVar104._12_4_ = 0;
            auVar105 = blendvps(auVar104,auVar114,auVar41);
            auVar115 = blendvps(auVar114,auVar123,auVar41);
            auVar42._8_4_ = -(uint)(auVar82._8_4_ < auVar115._8_4_);
            auVar42._4_4_ = auVar42._8_4_;
            auVar42._0_4_ = auVar42._8_4_;
            auVar42._12_4_ = auVar42._8_4_;
            SVar94 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar115,auVar82,auVar42);
            SVar83 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar82,auVar115,auVar42);
            *pSVar36 = SVar83;
            pSVar36[1] = SVar94;
            puVar29 = auVar105._0_8_;
            pSVar36 = pSVar36 + 2;
            puVar37 = puVar29;
          }
          else {
            lVar34 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
              }
            }
            auVar114._4_4_ = auVar116._8_4_;
            auVar114._0_4_ = auVar116._8_4_;
            auVar114._8_4_ = auVar116._8_4_;
            auVar114._12_4_ = auVar116._8_4_;
            auVar116 = blendvps(auVar115,auVar105,auVar114);
            auVar82 = blendvps(auVar105,auVar115,auVar114);
            auVar122._8_4_ = tNear.field_0.i[lVar34];
            auVar122._0_8_ = *(undefined8 *)(uVar38 + lVar34 * 8);
            auVar122._12_4_ = 0;
            auVar43._8_4_ = -(uint)(iVar6 < tNear.field_0.i[lVar34]);
            auVar43._4_4_ = auVar43._8_4_;
            auVar43._0_4_ = auVar43._8_4_;
            auVar43._12_4_ = auVar43._8_4_;
            auVar115 = blendvps(auVar122,auVar123,auVar43);
            auVar105 = blendvps(auVar123,auVar122,auVar43);
            auVar44._8_4_ = -(uint)(auVar82._8_4_ < auVar105._8_4_);
            auVar44._4_4_ = auVar44._8_4_;
            auVar44._0_4_ = auVar44._8_4_;
            auVar44._12_4_ = auVar44._8_4_;
            auVar123 = blendvps(auVar105,auVar82,auVar44);
            SVar83 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar82,auVar105,auVar44);
            auVar45._8_4_ = -(uint)(auVar116._8_4_ < auVar115._8_4_);
            auVar45._4_4_ = auVar45._8_4_;
            auVar45._0_4_ = auVar45._8_4_;
            auVar45._12_4_ = auVar45._8_4_;
            auVar82 = blendvps(auVar115,auVar116,auVar45);
            auVar105 = blendvps(auVar116,auVar115,auVar45);
            auVar46._8_4_ = -(uint)(auVar105._8_4_ < auVar123._8_4_);
            auVar46._4_4_ = auVar46._8_4_;
            auVar46._0_4_ = auVar46._8_4_;
            auVar46._12_4_ = auVar46._8_4_;
            SVar94 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar123,auVar105,auVar46);
            SVar117 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar105,auVar123,auVar46);
            *pSVar36 = SVar83;
            pSVar36[1] = SVar117;
            pSVar36[2] = SVar94;
            puVar29 = auVar82._0_8_;
            pSVar36 = pSVar36 + 3;
            puVar37 = puVar29;
          }
        }
      }
    }
    uVar38 = (ulong)puVar37 & 0xfffffffffffffff0;
    for (lVar34 = 0; lVar34 != (ulong)((uint)puVar37 & 0xf) - 8; lVar34 = lVar34 + 1) {
      lVar30 = lVar34 * 0xe0;
      puVar3 = (undefined8 *)(uVar38 + 0xd0 + lVar30);
      local_11b8 = *puVar3;
      uStack_11b0 = puVar3[1];
      pfVar2 = (float *)(uVar38 + lVar30);
      fVar165 = *pfVar2;
      fVar166 = pfVar2[1];
      fVar167 = pfVar2[2];
      fVar168 = pfVar2[3];
      pfVar2 = (float *)(uVar38 + 0x10 + lVar30);
      fVar93 = *pfVar2;
      fVar100 = pfVar2[1];
      fVar101 = pfVar2[2];
      fVar102 = pfVar2[3];
      pfVar2 = (float *)(uVar38 + 0x20 + lVar30);
      fVar103 = *pfVar2;
      fVar110 = pfVar2[1];
      fVar111 = pfVar2[2];
      fVar112 = pfVar2[3];
      pfVar2 = (float *)(uVar38 + 0x40 + lVar30);
      local_1238 = *(undefined8 *)pfVar2;
      uStack_1230 = *(undefined8 *)(pfVar2 + 2);
      fVar141 = fVar93 - *pfVar2;
      fVar144 = fVar100 - pfVar2[1];
      fVar147 = fVar101 - pfVar2[2];
      fVar150 = fVar102 - pfVar2[3];
      pfVar2 = (float *)(uVar38 + 0x50 + lVar30);
      local_12b8 = *(undefined8 *)pfVar2;
      uStack_12b0 = *(undefined8 *)(pfVar2 + 2);
      fVar128 = fVar103 - *pfVar2;
      fVar131 = fVar110 - pfVar2[1];
      fVar133 = fVar111 - pfVar2[2];
      fVar135 = fVar112 - pfVar2[3];
      pfVar2 = (float *)(uVar38 + 0x90 + lVar30);
      fVar61 = pfVar2[2];
      fVar64 = pfVar2[3];
      fVar157 = *pfVar2 - fVar165;
      fVar159 = pfVar2[1] - fVar166;
      fVar160 = fVar61 - fVar167;
      fVar161 = fVar64 - fVar168;
      pauVar4 = (undefined1 (*) [16])(uVar38 + 0xa0 + lVar30);
      auVar82 = *pauVar4;
      fVar59 = *(float *)*pauVar4 - fVar93;
      fVar62 = *(float *)(*pauVar4 + 4) - fVar100;
      fVar80 = *(float *)(*pauVar4 + 8) - fVar101;
      fVar87 = *(float *)(*pauVar4 + 0xc) - fVar102;
      pfVar5 = (float *)(uVar38 + 0xb0 + lVar30);
      fVar143 = *pfVar5;
      fVar146 = pfVar5[1];
      fVar149 = pfVar5[2];
      fVar152 = pfVar5[3];
      fVar89 = fVar143 - fVar103;
      fVar91 = fVar146 - fVar110;
      fVar126 = fVar149 - fVar111;
      fVar127 = fVar152 - fVar112;
      local_10f8[0] = fVar128 * fVar59 - fVar141 * fVar89;
      local_10f8[1] = fVar131 * fVar62 - fVar144 * fVar91;
      local_10f8[2] = fVar133 * fVar80 - fVar147 * fVar126;
      local_10f8[3] = fVar135 * fVar87 - fVar150 * fVar127;
      fVar66 = *(float *)(ray + k * 4);
      fVar76 = *(float *)(ray + k * 4 + 0x10);
      fVar79 = *(float *)(ray + k * 4 + 0x40);
      fStack_12c4 = *(float *)(ray + k * 4 + 0x50);
      local_f88 = fVar165 - fVar66;
      fStack_f84 = fVar166 - fVar66;
      fStack_f80 = fVar167 - fVar66;
      fStack_f7c = fVar168 - fVar66;
      fVar93 = fVar93 - fVar76;
      fVar100 = fVar100 - fVar76;
      fVar101 = fVar101 - fVar76;
      fVar102 = fVar102 - fVar76;
      fVar65 = local_f88 * fStack_12c4 - fVar93 * fVar79;
      fVar75 = fStack_f84 * fStack_12c4 - fVar100 * fVar79;
      fVar39 = fStack_f80 * fStack_12c4 - fVar101 * fVar79;
      fVar57 = fStack_f7c * fStack_12c4 - fVar102 * fVar79;
      pauVar4 = (undefined1 (*) [16])(uVar38 + 0x30 + lVar30);
      _local_12d8 = *pauVar4;
      fVar165 = fVar165 - *(float *)*pauVar4;
      fVar166 = fVar166 - *(float *)(*pauVar4 + 4);
      fVar167 = fVar167 - *(float *)(*pauVar4 + 8);
      fVar168 = fVar168 - *(float *)(*pauVar4 + 0xc);
      local_1098 = fVar165 * fVar89 - fVar128 * fVar157;
      fStack_1094 = fVar166 * fVar91 - fVar131 * fVar159;
      fStack_1090 = fVar167 * fVar126 - fVar133 * fVar160;
      fStack_108c = fVar168 * fVar127 - fVar135 * fVar161;
      fStack_1294 = *(float *)(ray + k * 4 + 0x20);
      fVar121 = *(float *)(ray + k * 4 + 0x60);
      auVar118._4_4_ = fVar121;
      auVar118._0_4_ = fVar121;
      auVar118._8_4_ = fVar121;
      auVar118._12_4_ = fVar121;
      fVar103 = fVar103 - fStack_1294;
      fVar110 = fVar110 - fStack_1294;
      fVar111 = fVar111 - fStack_1294;
      fVar112 = fVar112 - fStack_1294;
      fVar137 = fVar103 * fVar79 - local_f88 * fVar121;
      fVar138 = fVar110 * fVar79 - fStack_f84 * fVar121;
      fVar139 = fVar111 * fVar79 - fStack_f80 * fVar121;
      fVar140 = fVar112 * fVar79 - fStack_f7c * fVar121;
      fVar142 = fVar141 * fVar157 - fVar165 * fVar59;
      fVar145 = fVar144 * fVar159 - fVar166 * fVar62;
      fVar148 = fVar147 * fVar160 - fVar167 * fVar80;
      fVar151 = fVar150 * fVar161 - fVar168 * fVar87;
      fVar129 = fVar93 * fVar121 - fVar103 * fStack_12c4;
      fVar132 = fVar100 * fVar121 - fVar110 * fStack_12c4;
      fVar134 = fVar101 * fVar121 - fVar111 * fStack_12c4;
      fVar136 = fVar102 * fVar121 - fVar112 * fStack_12c4;
      fVar153 = local_10f8[0] * fVar79 + local_1098 * fStack_12c4 + fVar142 * fVar121;
      fVar154 = local_10f8[1] * fVar79 + fStack_1094 * fStack_12c4 + fVar145 * fVar121;
      fVar155 = local_10f8[2] * fVar79 + fStack_1090 * fStack_12c4 + fVar148 * fVar121;
      fVar156 = local_10f8[3] * fVar79 + fStack_108c * fStack_12c4 + fVar151 * fVar121;
      uVar40 = (uint)fVar153 & 0x80000000;
      uVar58 = (uint)fVar154 & 0x80000000;
      uVar60 = (uint)fVar155 & 0x80000000;
      uVar63 = (uint)fVar156 & 0x80000000;
      tNear.field_0.i[0] = (uint)(fVar157 * fVar129 + fVar59 * fVar137 + fVar89 * fVar65) ^ uVar40;
      tNear.field_0.i[1] = (uint)(fVar159 * fVar132 + fVar62 * fVar138 + fVar91 * fVar75) ^ uVar58;
      tNear.field_0.i[2] = (uint)(fVar160 * fVar134 + fVar80 * fVar139 + fVar126 * fVar39) ^ uVar60;
      tNear.field_0.i[3] = (uint)(fVar161 * fVar136 + fVar87 * fVar140 + fVar127 * fVar57) ^ uVar63;
      fVar65 = (float)((uint)(fVar129 * fVar165 + fVar137 * fVar141 + fVar65 * fVar128) ^ uVar40);
      fVar166 = (float)((uint)(fVar132 * fVar166 + fVar138 * fVar144 + fVar75 * fVar131) ^ uVar58);
      fVar167 = (float)((uint)(fVar134 * fVar167 + fVar139 * fVar147 + fVar39 * fVar133) ^ uVar60);
      fVar168 = (float)((uint)(fVar136 * fVar168 + fVar140 * fVar150 + fVar57 * fVar135) ^ uVar63);
      fVar121 = ABS(fVar153);
      fVar165 = ABS(fVar154);
      auVar124._0_8_ = CONCAT44(fVar154,fVar153) & 0x7fffffff7fffffff;
      auVar124._8_4_ = ABS(fVar155);
      auVar124._12_4_ = ABS(fVar156);
      bVar21 = ((0.0 <= fVar65 && 0.0 <= tNear.field_0.v[0]) && fVar153 != 0.0) &&
               tNear.field_0.v[0] + fVar65 <= fVar121;
      auVar125._0_4_ = -(uint)bVar21;
      bVar22 = ((0.0 <= fVar166 && 0.0 <= tNear.field_0.v[1]) && fVar154 != 0.0) &&
               tNear.field_0.v[1] + fVar166 <= fVar165;
      auVar125._4_4_ = -(uint)bVar22;
      bVar20 = ((0.0 <= fVar167 && 0.0 <= tNear.field_0.v[2]) && fVar155 != 0.0) &&
               tNear.field_0.v[2] + fVar167 <= auVar124._8_4_;
      auVar125._8_4_ = -(uint)bVar20;
      bVar19 = ((0.0 <= fVar168 && 0.0 <= tNear.field_0.v[3]) && fVar156 != 0.0) &&
               tNear.field_0.v[3] + fVar168 <= auVar124._12_4_;
      auVar125._12_4_ = -(uint)bVar19;
      lVar1 = uVar38 + lVar30;
      iVar25 = movmskps((int)lVar30,auVar125);
      local_1208._0_4_ = (float)*(undefined8 *)pfVar2;
      local_1208._4_4_ = (float)((ulong)*(undefined8 *)pfVar2 >> 0x20);
      local_1278._0_4_ = auVar82._0_4_;
      local_1278._4_4_ = auVar82._4_4_;
      fStack_1270 = auVar82._8_4_;
      fStack_126c = auVar82._12_4_;
      fStack_1200 = fVar61;
      fStack_11fc = fVar64;
      if (iVar25 == 0) {
        uVar40 = 0;
      }
      else {
        fVar103 = (float)(uVar40 ^ (uint)(local_f88 * local_10f8[0] +
                                         fVar93 * local_1098 + fVar103 * fVar142));
        fVar110 = (float)(uVar58 ^ (uint)(fStack_f84 * local_10f8[1] +
                                         fVar100 * fStack_1094 + fVar110 * fVar145));
        fVar101 = (float)(uVar60 ^ (uint)(fStack_f80 * local_10f8[2] +
                                         fVar101 * fStack_1090 + fVar111 * fVar148));
        fVar102 = (float)(uVar63 ^ (uint)(fStack_f7c * local_10f8[3] +
                                         fVar102 * fStack_108c + fVar112 * fVar151));
        fVar93 = *(float *)(ray + k * 4 + 0x30);
        fVar100 = *(float *)(ray + k * 4 + 0x80);
        bVar21 = (fVar93 * fVar121 < fVar103 && fVar103 <= fVar100 * fVar121) && bVar21;
        bVar22 = (fVar93 * fVar165 < fVar110 && fVar110 <= fVar100 * fVar165) && bVar22;
        valid.field_0._0_8_ = CONCAT44(-(uint)bVar22,-(uint)bVar21);
        bVar20 = (fVar93 * auVar124._8_4_ < fVar101 && fVar101 <= fVar100 * auVar124._8_4_) &&
                 bVar20;
        valid.field_0.i[2] = -(uint)bVar20;
        bVar19 = (fVar93 * auVar124._12_4_ < fVar102 && fVar102 <= fVar100 * auVar124._12_4_) &&
                 bVar19;
        valid.field_0.i[3] = -(uint)bVar19;
        uVar40 = movmskps(iVar25,(undefined1  [16])valid.field_0);
        if (uVar40 != 0) {
          fStack_1270 = 0.0;
          fStack_126c = 0.0;
          local_10e8._4_4_ = fStack_1094;
          local_10e8._0_4_ = local_1098;
          local_10e8._12_4_ = fStack_108c;
          local_10e8._8_4_ = fStack_1090;
          local_10c8._8_8_ = uStack_fe0;
          local_10c8._0_8_ = local_fe8;
          pSVar8 = context->scene;
          auVar82 = rcpps(auVar118,auVar124);
          fVar66 = auVar82._0_4_;
          fVar76 = auVar82._4_4_;
          fVar93 = auVar82._8_4_;
          fVar111 = auVar82._12_4_;
          fVar112 = (float)DAT_01f46a60;
          fVar61 = DAT_01f46a60._4_4_;
          fVar64 = DAT_01f46a60._12_4_;
          fVar79 = DAT_01f46a60._8_4_;
          fVar66 = (fVar112 - fVar121 * fVar66) * fVar66 + fVar66;
          fVar76 = (fVar61 - fVar165 * fVar76) * fVar76 + fVar76;
          fVar93 = (fVar79 - auVar124._8_4_ * fVar93) * fVar93 + fVar93;
          fVar111 = (fVar64 - auVar124._12_4_ * fVar111) * fVar111 + fVar111;
          fVar103 = fVar103 * fVar66;
          fVar110 = fVar110 * fVar76;
          fVar101 = fVar101 * fVar93;
          fVar102 = fVar102 * fVar111;
          local_1108[0] = fVar103;
          local_1108[1] = fVar110;
          local_1108[2] = fVar101;
          local_1108[3] = fVar102;
          auVar158._0_4_ = tNear.field_0.v[0] * fVar66;
          auVar158._4_4_ = tNear.field_0.v[1] * fVar76;
          auVar158._8_4_ = tNear.field_0.v[2] * fVar93;
          auVar158._12_4_ = tNear.field_0.v[3] * fVar111;
          auVar105 = minps(auVar158,_DAT_01f46a60);
          auVar84._0_4_ = fVar66 * fVar65;
          auVar84._4_4_ = fVar76 * fVar166;
          auVar84._8_4_ = fVar93 * fVar167;
          auVar84._12_4_ = fVar111 * fVar168;
          auVar82 = minps(auVar84,_DAT_01f46a60);
          auVar120._0_4_ = fVar112 - auVar105._0_4_;
          auVar120._4_4_ = fVar61 - auVar105._4_4_;
          auVar120._8_4_ = fVar79 - auVar105._8_4_;
          auVar120._12_4_ = fVar64 - auVar105._12_4_;
          auVar106._0_4_ = fVar112 - auVar82._0_4_;
          auVar106._4_4_ = fVar61 - auVar82._4_4_;
          auVar106._8_4_ = fVar79 - auVar82._8_4_;
          auVar106._12_4_ = fVar64 - auVar82._12_4_;
          local_1128 = blendvps(auVar105,auVar120,local_10c8);
          local_1118 = blendvps(auVar82,auVar106,local_10c8);
          local_10d8 = CONCAT44(fVar145,fVar142);
          uStack_10d0 = CONCAT44(fVar151,fVar148);
          auVar47._8_4_ = valid.field_0.i[2];
          auVar47._0_8_ = valid.field_0._0_8_;
          auVar47._12_4_ = valid.field_0.i[3];
          auVar15._4_4_ = fVar110;
          auVar15._0_4_ = fVar103;
          auVar15._8_4_ = fVar101;
          auVar15._12_4_ = fVar102;
          auVar105 = blendvps(_DAT_01f45a30,auVar15,auVar47);
          auVar107._4_4_ = auVar105._0_4_;
          auVar107._0_4_ = auVar105._4_4_;
          auVar107._8_4_ = auVar105._12_4_;
          auVar107._12_4_ = auVar105._8_4_;
          auVar82 = minps(auVar107,auVar105);
          auVar48._0_8_ = auVar82._8_8_;
          auVar48._8_4_ = auVar82._0_4_;
          auVar48._12_4_ = auVar82._4_4_;
          auVar82 = minps(auVar48,auVar82);
          auVar49._0_8_ =
               CONCAT44(-(uint)(auVar82._4_4_ == auVar105._4_4_ && bVar22),
                        -(uint)(auVar82._0_4_ == auVar105._0_4_ && bVar21));
          auVar49._8_4_ = -(uint)(auVar82._8_4_ == auVar105._8_4_ && bVar20);
          auVar49._12_4_ = -(uint)(auVar82._12_4_ == auVar105._12_4_ && bVar19);
          iVar25 = movmskps((int)pSVar8,auVar49);
          aVar96 = valid.field_0;
          if (iVar25 != 0) {
            aVar96.i[2] = auVar49._8_4_;
            aVar96._0_8_ = auVar49._0_8_;
            aVar96.i[3] = auVar49._12_4_;
          }
          uVar27 = movmskps(iVar25,(undefined1  [16])aVar96);
          uVar31 = CONCAT44((int)((ulong)pSVar8 >> 0x20),uVar27);
          lVar30 = 0;
          local_1278._0_4_ = fVar100;
          local_1278._4_4_ = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
LAB_006ff846:
          local_1028._4_4_ = *(uint *)(lVar1 + 0xc0 + lVar30 * 4);
          pGVar9 = (pSVar8->geometries).items[(uint)local_1028._4_4_].ptr;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_1278 + lVar30 * 4 + -0x10) = 0;
LAB_006ffb92:
            uVar40 = movmskps((int)lVar30,(undefined1  [16])valid.field_0);
            if (uVar40 == 0) goto LAB_0070034e;
            auVar16._4_4_ = fVar110;
            auVar16._0_4_ = fVar103;
            auVar16._8_4_ = fVar101;
            auVar16._12_4_ = fVar102;
            auVar105 = blendvps(_DAT_01f45a30,auVar16,(undefined1  [16])valid.field_0);
            auVar108._4_4_ = auVar105._0_4_;
            auVar108._0_4_ = auVar105._4_4_;
            auVar108._8_4_ = auVar105._12_4_;
            auVar108._12_4_ = auVar105._8_4_;
            auVar82 = minps(auVar108,auVar105);
            auVar68._0_8_ = auVar82._8_8_;
            auVar68._8_4_ = auVar82._0_4_;
            auVar68._12_4_ = auVar82._4_4_;
            auVar82 = minps(auVar68,auVar82);
            auVar69._0_8_ =
                 CONCAT44(-(uint)(auVar82._4_4_ == auVar105._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar82._0_4_ == auVar105._0_4_) & valid.field_0._0_4_);
            auVar69._8_4_ = -(uint)(auVar82._8_4_ == auVar105._8_4_) & valid.field_0._8_4_;
            auVar69._12_4_ = -(uint)(auVar82._12_4_ == auVar105._12_4_) & valid.field_0._12_4_;
            iVar25 = movmskps(uVar40,auVar69);
            aVar51 = valid.field_0;
            if (iVar25 != 0) {
              aVar51.i[2] = auVar69._8_4_;
              aVar51._0_8_ = auVar69._0_8_;
              aVar51.i[3] = auVar69._12_4_;
            }
            uVar27 = movmskps(iVar25,(undefined1  [16])aVar51);
            uVar31 = CONCAT44((int)((ulong)lVar30 >> 0x20),uVar27);
            lVar30 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
              }
            }
            goto LAB_006ff846;
          }
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
            local_1058 = *(undefined4 *)(local_1128 + lVar30 * 4);
            local_1048 = *(undefined4 *)(local_1118 + lVar30 * 4);
            local_1088._4_4_ = local_10f8[lVar30];
            uVar27 = *(undefined4 *)(local_10e8 + lVar30 * 4);
            uVar28 = *(undefined4 *)((long)&local_11b8 + lVar30 * 4);
            local_1038._4_4_ = uVar28;
            local_1038._0_4_ = uVar28;
            local_1038._8_4_ = uVar28;
            local_1038._12_4_ = uVar28;
            local_1078._4_4_ = uVar27;
            local_1078._0_4_ = uVar27;
            local_1078._8_4_ = uVar27;
            local_1078._12_4_ = uVar27;
            local_1068._4_4_ = *(undefined4 *)((long)&local_10d8 + lVar30 * 4);
            local_1088._0_4_ = local_1088._4_4_;
            fStack_1080 = (float)local_1088._4_4_;
            fStack_107c = (float)local_1088._4_4_;
            local_1068._0_4_ = local_1068._4_4_;
            local_1068._8_4_ = local_1068._4_4_;
            local_1068._12_4_ = local_1068._4_4_;
            uStack_1054 = local_1058;
            uStack_1050 = local_1058;
            uStack_104c = local_1058;
            uStack_1044 = local_1048;
            uStack_1040 = local_1048;
            uStack_103c = local_1048;
            local_1028._0_4_ = local_1028._4_4_;
            local_1028._8_4_ = local_1028._4_4_;
            local_1028._12_4_ = local_1028._4_4_;
            local_1018 = context->user->instID[0];
            uStack_1014 = local_1018;
            uStack_1010 = local_1018;
            uStack_100c = local_1018;
            local_1008 = context->user->instPrimID[0];
            uStack_1004 = local_1008;
            uStack_1000 = local_1008;
            uStack_ffc = local_1008;
            *(float *)(ray + k * 4 + 0x80) = local_1108[lVar30];
            local_1228 = *(undefined1 (*) [16])
                          (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
            args.valid = (int *)local_1228;
            args.geometryUserPtr = pGVar9->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)local_1088;
            args.N = 4;
            local_1218 = fVar103;
            fStack_1214 = fVar110;
            fStack_1210 = fVar101;
            fStack_120c = fVar102;
            local_1208 = lVar34;
            args.ray = (RTCRayN *)ray;
            if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar9->intersectionFilterN)(&args);
            }
            if (local_1228 == (undefined1  [16])0x0) {
              auVar67._8_4_ = 0xffffffff;
              auVar67._0_8_ = 0xffffffffffffffff;
              auVar67._12_4_ = 0xffffffff;
              auVar67 = auVar67 ^ _DAT_01f46b70;
            }
            else {
              p_Var10 = context->args->filter;
              if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var10)(&args);
              }
              auVar50._0_4_ = -(uint)(local_1228._0_4_ == 0);
              auVar50._4_4_ = -(uint)(local_1228._4_4_ == 0);
              auVar50._8_4_ = -(uint)(local_1228._8_4_ == 0);
              auVar50._12_4_ = -(uint)(local_1228._12_4_ == 0);
              auVar67 = auVar50 ^ _DAT_01f46b70;
              if (local_1228 != (undefined1  [16])0x0) {
                auVar82 = blendvps(*(undefined1 (*) [16])args.hit,
                                   *(undefined1 (*) [16])(args.ray + 0xc0),auVar50);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                   *(undefined1 (*) [16])(args.ray + 0xd0),auVar50);
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                   *(undefined1 (*) [16])(args.ray + 0xe0),auVar50);
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                   *(undefined1 (*) [16])(args.ray + 0xf0),auVar50);
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                   *(undefined1 (*) [16])(args.ray + 0x100),auVar50);
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                   *(undefined1 (*) [16])(args.ray + 0x110),auVar50);
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                   *(undefined1 (*) [16])(args.ray + 0x120),auVar50);
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                   *(undefined1 (*) [16])(args.ray + 0x130),auVar50);
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                   *(undefined1 (*) [16])(args.ray + 0x140),auVar50);
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar82;
              }
            }
            if ((_DAT_01f46b40 & auVar67) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_1278._0_4_;
            }
            else {
              _local_1278 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_1278 + lVar30 * 4 + -0x10) = 0;
            valid.field_0.i[0] = -(uint)(local_1218 <= (float)local_1278._0_4_) & valid.field_0.i[0]
            ;
            valid.field_0.i[1] =
                 -(uint)(fStack_1214 <= (float)local_1278._0_4_) & valid.field_0.i[1];
            valid.field_0.i[2] =
                 -(uint)(fStack_1210 <= (float)local_1278._0_4_) & valid.field_0.i[2];
            valid.field_0.i[3] =
                 -(uint)(fStack_120c <= (float)local_1278._0_4_) & valid.field_0.i[3];
            lVar34 = local_1208;
            fVar103 = local_1218;
            fVar110 = fStack_1214;
            fVar101 = fStack_1210;
            fVar102 = fStack_120c;
            goto LAB_006ffb92;
          }
          uVar27 = *(undefined4 *)(local_1128 + lVar30 * 4);
          uVar28 = *(undefined4 *)(local_1118 + lVar30 * 4);
          *(float *)(ray + k * 4 + 0x80) = local_1108[lVar30];
          *(float *)(ray + k * 4 + 0xc0) = local_10f8[lVar30];
          *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10e8 + lVar30 * 4);
          *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_10d8 + lVar30 * 4);
          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar27;
          *(undefined4 *)(ray + k * 4 + 0x100) = uVar28;
          *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_11b8 + lVar30 * 4);
          *(undefined4 *)(ray + k * 4 + 0x120) = local_1028._4_4_;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          uVar40 = context->user->instPrimID[0];
          *(uint *)(ray + k * 4 + 0x140) = uVar40;
LAB_0070034e:
          _local_12d8 = *(undefined1 (*) [16])(lVar1 + 0x30);
          local_1238 = *(undefined8 *)(lVar1 + 0x40);
          uStack_1230 = *(undefined8 *)(lVar1 + 0x48);
          local_12b8 = *(undefined8 *)(lVar1 + 0x50);
          uStack_12b0 = *(undefined8 *)(lVar1 + 0x58);
          local_1208._0_4_ = *(float *)(lVar1 + 0x90);
          local_1208._4_4_ = *(float *)(lVar1 + 0x94);
          fVar61 = *(float *)(lVar1 + 0x98);
          fVar64 = *(float *)(lVar1 + 0x9c);
          local_1278._0_4_ = *(float *)(lVar1 + 0xa0);
          local_1278._4_4_ = *(float *)(lVar1 + 0xa4);
          fStack_1270 = *(float *)(lVar1 + 0xa8);
          fStack_126c = *(float *)(lVar1 + 0xac);
          fVar143 = *(float *)(lVar1 + 0xb0);
          fVar146 = *(float *)(lVar1 + 0xb4);
          fVar149 = *(float *)(lVar1 + 0xb8);
          fVar152 = *(float *)(lVar1 + 0xbc);
          fVar66 = *(float *)(ray + k * 4);
          fVar76 = *(float *)(ray + k * 4 + 0x10);
          fStack_1294 = *(float *)(ray + k * 4 + 0x20);
          fVar79 = *(float *)(ray + k * 4 + 0x40);
          fStack_12c4 = *(float *)(ray + k * 4 + 0x50);
          uVar27 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar118._4_4_ = uVar27;
          auVar118._0_4_ = uVar27;
          auVar118._8_4_ = uVar27;
          auVar118._12_4_ = uVar27;
        }
      }
      fVar121 = *(float *)(lVar1 + 0x60);
      fVar165 = *(float *)(lVar1 + 100);
      fVar167 = *(float *)(lVar1 + 0x68);
      fVar168 = *(float *)(lVar1 + 0x6c);
      fVar93 = *(float *)(lVar1 + 0x70);
      fVar100 = *(float *)(lVar1 + 0x74);
      fVar101 = *(float *)(lVar1 + 0x78);
      fVar102 = *(float *)(lVar1 + 0x7c);
      fVar103 = *(float *)(lVar1 + 0x80);
      fVar110 = *(float *)(lVar1 + 0x84);
      fVar111 = *(float *)(lVar1 + 0x88);
      fVar65 = *(float *)(lVar1 + 0x8c);
      local_1208._0_4_ = fVar121 - (float)local_1208;
      local_1208._4_4_ = fVar165 - local_1208._4_4_;
      fVar61 = fVar167 - fVar61;
      fVar64 = fVar168 - fVar64;
      local_1278._0_4_ = fVar93 - (float)local_1278._0_4_;
      local_1278._4_4_ = fVar100 - (float)local_1278._4_4_;
      fStack_1270 = fVar101 - fStack_1270;
      fStack_126c = fVar102 - fStack_126c;
      fVar143 = fVar103 - fVar143;
      fVar146 = fVar110 - fVar146;
      fVar149 = fVar111 - fVar149;
      fVar152 = fVar65 - fVar152;
      fVar131 = (float)local_12d8._0_4_ - fVar121;
      fVar132 = (float)local_12d8._4_4_ - fVar165;
      fStack_12d0 = fStack_12d0 - fVar167;
      fStack_12cc = fStack_12cc - fVar168;
      local_1238._0_4_ = (float)local_1238 - fVar93;
      local_1238._4_4_ = local_1238._4_4_ - fVar100;
      uStack_1230._0_4_ = (float)uStack_1230 - fVar101;
      uStack_1230._4_4_ = uStack_1230._4_4_ - fVar102;
      fVar137 = (float)local_12b8 - fVar103;
      fVar138 = local_12b8._4_4_ - fVar110;
      fVar139 = (float)uStack_12b0 - fVar111;
      fVar140 = uStack_12b0._4_4_ - fVar65;
      fVar121 = fVar121 - fVar66;
      fVar165 = fVar165 - fVar66;
      fVar167 = fVar167 - fVar66;
      fVar168 = fVar168 - fVar66;
      fVar103 = fVar103 - fStack_1294;
      fVar110 = fVar110 - fStack_1294;
      fVar111 = fVar111 - fStack_1294;
      fVar65 = fVar65 - fStack_1294;
      fVar66 = auVar118._0_4_;
      fVar166 = auVar118._4_4_;
      fVar80 = auVar118._8_4_;
      fVar89 = auVar118._12_4_;
      fVar133 = fVar103 * fVar79 - fVar121 * fVar66;
      fVar134 = fVar110 * fVar79 - fVar165 * fVar166;
      fVar135 = fVar111 * fVar79 - fVar167 * fVar80;
      fVar136 = fVar65 * fVar79 - fVar168 * fVar89;
      local_10f8[0] = fVar143 * (float)local_1238 - (float)local_1278._0_4_ * fVar137;
      local_10f8[1] = fVar146 * local_1238._4_4_ - (float)local_1278._4_4_ * fVar138;
      local_10f8[2] = fVar149 * (float)uStack_1230 - fStack_1270 * fVar139;
      local_10f8[3] = fVar152 * uStack_1230._4_4_ - fStack_126c * fVar140;
      fVar93 = fVar93 - fVar76;
      fVar100 = fVar100 - fVar76;
      fVar101 = fVar101 - fVar76;
      fVar102 = fVar102 - fVar76;
      fVar112 = fVar121 * fStack_12c4 - fVar93 * fVar79;
      fVar75 = fVar165 * fStack_12c4 - fVar100 * fVar79;
      fVar39 = fVar167 * fStack_12c4 - fVar101 * fVar79;
      fVar57 = fVar168 * fStack_12c4 - fVar102 * fVar79;
      local_10e8._0_4_ = (float)local_1208 * fVar137 - fVar143 * fVar131;
      local_10e8._4_4_ = local_1208._4_4_ * fVar138 - fVar146 * fVar132;
      local_10e8._8_4_ = fVar61 * fVar139 - fVar149 * fStack_12d0;
      local_10e8._12_4_ = fVar64 * fVar140 - fVar152 * fStack_12cc;
      fVar59 = (float)local_1278._0_4_ * fVar131 - (float)local_1208 * (float)local_1238;
      fVar62 = (float)local_1278._4_4_ * fVar132 - local_1208._4_4_ * local_1238._4_4_;
      fVar87 = fStack_1270 * fStack_12d0 - fVar61 * (float)uStack_1230;
      fVar91 = fStack_126c * fStack_12cc - fVar64 * uStack_1230._4_4_;
      fVar126 = fVar93 * fVar66 - fVar103 * fStack_12c4;
      fVar127 = fVar100 * fVar166 - fVar110 * fStack_12c4;
      fVar128 = fVar101 * fVar80 - fVar111 * fStack_12c4;
      fVar129 = fVar102 * fVar89 - fVar65 * fStack_12c4;
      local_12b8 = CONCAT44(fVar62,fVar59);
      uStack_12b0 = CONCAT44(fVar91,fVar87);
      fVar66 = fVar79 * local_10f8[0] + fStack_12c4 * (float)local_10e8._0_4_ + fVar66 * fVar59;
      fVar76 = fVar79 * local_10f8[1] + fStack_12c4 * (float)local_10e8._4_4_ + fVar166 * fVar62;
      fVar166 = fVar79 * local_10f8[2] + fStack_12c4 * (float)local_10e8._8_4_ + fVar80 * fVar87;
      fVar79 = fVar79 * local_10f8[3] + fStack_12c4 * (float)local_10e8._12_4_ + fVar89 * fVar91;
      uVar58 = (uint)fVar66 & 0x80000000;
      uVar60 = (uint)fVar76 & 0x80000000;
      uVar63 = (uint)fVar166 & 0x80000000;
      uVar81 = (uint)fVar79 & 0x80000000;
      tNear.field_0.i[0] =
           (uint)(fVar131 * fVar126 + (float)local_1238 * fVar133 + fVar137 * fVar112) ^ uVar58;
      tNear.field_0.i[1] =
           (uint)(fVar132 * fVar127 + local_1238._4_4_ * fVar134 + fVar138 * fVar75) ^ uVar60;
      tNear.field_0.i[2] =
           (uint)(fStack_12d0 * fVar128 + (float)uStack_1230 * fVar135 + fVar139 * fVar39) ^ uVar63;
      tNear.field_0.i[3] =
           (uint)(fStack_12cc * fVar129 + uStack_1230._4_4_ * fVar136 + fVar140 * fVar57) ^ uVar81;
      fVar80 = (float)((uint)(fVar126 * (float)local_1208 +
                             fVar133 * (float)local_1278._0_4_ + fVar112 * fVar143) ^ uVar58);
      fVar75 = (float)((uint)(fVar127 * local_1208._4_4_ +
                             fVar134 * (float)local_1278._4_4_ + fVar75 * fVar146) ^ uVar60);
      fVar149 = (float)((uint)(fVar128 * fVar61 + fVar135 * fStack_1270 + fVar39 * fVar149) ^ uVar63
                       );
      fVar152 = (float)((uint)(fVar129 * fVar64 + fVar136 * fStack_126c + fVar57 * fVar152) ^ uVar81
                       );
      fVar143 = ABS(fVar66);
      fVar146 = ABS(fVar76);
      auVar119._0_8_ = CONCAT44(fVar76,fVar66) & 0x7fffffff7fffffff;
      auVar119._8_4_ = ABS(fVar166);
      auVar119._12_4_ = ABS(fVar79);
      bVar21 = tNear.field_0.v[0] + fVar80 <= fVar143 &&
               ((0.0 <= fVar80 && 0.0 <= tNear.field_0.v[0]) && fVar66 != 0.0);
      auVar95._0_4_ = -(uint)bVar21;
      bVar22 = tNear.field_0.v[1] + fVar75 <= fVar146 &&
               ((0.0 <= fVar75 && 0.0 <= tNear.field_0.v[1]) && fVar76 != 0.0);
      auVar95._4_4_ = -(uint)bVar22;
      bVar20 = tNear.field_0.v[2] + fVar149 <= auVar119._8_4_ &&
               ((0.0 <= fVar149 && 0.0 <= tNear.field_0.v[2]) && fVar166 != 0.0);
      auVar95._8_4_ = -(uint)bVar20;
      bVar19 = tNear.field_0.v[3] + fVar152 <= auVar119._12_4_ &&
               ((0.0 <= fVar152 && 0.0 <= tNear.field_0.v[3]) && fVar79 != 0.0);
      auVar95._12_4_ = -(uint)bVar19;
      uVar40 = movmskps(uVar40,auVar95);
      puVar29 = (undefined1 *)(ulong)uVar40;
      fVar166 = local_10a8;
      fVar112 = fStack_10a4;
      fVar61 = fStack_10a0;
      fVar64 = fStack_109c;
      iVar25 = local_10b8;
      iVar162 = iStack_10b4;
      iVar163 = iStack_10b0;
      iVar164 = iStack_10ac;
      if (uVar40 != 0) {
        fVar76 = (float)(uVar58 ^ (uint)(fVar121 * local_10f8[0] +
                                        fVar93 * (float)local_10e8._0_4_ + fVar103 * fVar59));
        fVar79 = (float)(uVar60 ^ (uint)(fVar165 * local_10f8[1] +
                                        fVar100 * (float)local_10e8._4_4_ + fVar110 * fVar62));
        fVar121 = (float)(uVar63 ^ (uint)(fVar167 * local_10f8[2] +
                                         fVar101 * (float)local_10e8._8_4_ + fVar111 * fVar87));
        fVar165 = (float)(uVar81 ^ (uint)(fVar168 * local_10f8[3] +
                                         fVar102 * (float)local_10e8._12_4_ + fVar65 * fVar91));
        fVar66 = *(float *)(ray + k * 4 + 0x30);
        bVar11 = fVar66 * fVar143 < fVar76;
        bVar12 = fVar66 * fVar146 < fVar79;
        bVar13 = fVar66 * auVar119._8_4_ < fVar121;
        bVar14 = fVar66 * auVar119._12_4_ < fVar165;
        auVar85._4_4_ = -(uint)bVar12;
        auVar85._0_4_ = -(uint)bVar11;
        auVar85._8_4_ = -(uint)bVar13;
        auVar85._12_4_ = -(uint)bVar14;
        local_1278._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
        local_1278._4_4_ = 0;
        fStack_1270 = 0.0;
        fStack_126c = 0.0;
        bVar21 = (fVar76 <= (float)local_1278._0_4_ * fVar143 && bVar11) && bVar21;
        bVar22 = (fVar79 <= (float)local_1278._0_4_ * fVar146 && bVar12) && bVar22;
        valid.field_0._0_8_ = CONCAT44(-(uint)bVar22,-(uint)bVar21);
        bVar20 = (fVar121 <= (float)local_1278._0_4_ * auVar119._8_4_ && bVar13) && bVar20;
        valid.field_0.i[2] = -(uint)bVar20;
        bVar19 = (fVar165 <= (float)local_1278._0_4_ * auVar119._12_4_ && bVar14) && bVar19;
        valid.field_0.i[3] = -(uint)bVar19;
        uVar40 = movmskps(uVar40,(undefined1  [16])valid.field_0);
        puVar29 = (undefined1 *)(ulong)uVar40;
        if (uVar40 != 0) {
          local_10c8._8_8_ = uStack_ff0;
          local_10c8._0_8_ = local_ff8;
          pSVar8 = context->scene;
          auVar82 = rcpps(auVar85,auVar119);
          fVar66 = auVar82._0_4_;
          fVar167 = auVar82._4_4_;
          fVar168 = auVar82._8_4_;
          fVar93 = auVar82._12_4_;
          fVar101 = (float)DAT_01f46a60;
          fVar102 = DAT_01f46a60._4_4_;
          fVar103 = DAT_01f46a60._12_4_;
          fVar100 = DAT_01f46a60._8_4_;
          fVar66 = (fVar101 - fVar143 * fVar66) * fVar66 + fVar66;
          fVar167 = (fVar102 - fVar146 * fVar167) * fVar167 + fVar167;
          fVar168 = (fVar100 - auVar119._8_4_ * fVar168) * fVar168 + fVar168;
          fVar93 = (fVar103 - auVar119._12_4_ * fVar93) * fVar93 + fVar93;
          fVar76 = fVar76 * fVar66;
          fVar79 = fVar79 * fVar167;
          fVar121 = fVar121 * fVar168;
          fVar165 = fVar165 * fVar93;
          local_1108[0] = fVar76;
          local_1108[1] = fVar79;
          local_1108[2] = fVar121;
          local_1108[3] = fVar165;
          auVar130._0_4_ = tNear.field_0.v[0] * fVar66;
          auVar130._4_4_ = tNear.field_0.v[1] * fVar167;
          auVar130._8_4_ = tNear.field_0.v[2] * fVar168;
          auVar130._12_4_ = tNear.field_0.v[3] * fVar93;
          auVar105 = minps(auVar130,_DAT_01f46a60);
          auVar97._0_4_ = fVar66 * fVar80;
          auVar97._4_4_ = fVar167 * fVar75;
          auVar97._8_4_ = fVar168 * fVar149;
          auVar97._12_4_ = fVar93 * fVar152;
          auVar82 = minps(auVar97,_DAT_01f46a60);
          auVar86._0_4_ = fVar101 - auVar105._0_4_;
          auVar86._4_4_ = fVar102 - auVar105._4_4_;
          auVar86._8_4_ = fVar100 - auVar105._8_4_;
          auVar86._12_4_ = fVar103 - auVar105._12_4_;
          auVar109._0_4_ = fVar101 - auVar82._0_4_;
          auVar109._4_4_ = fVar102 - auVar82._4_4_;
          auVar109._8_4_ = fVar100 - auVar82._8_4_;
          auVar109._12_4_ = fVar103 - auVar82._12_4_;
          local_1128 = blendvps(auVar105,auVar86,local_10c8);
          local_1118 = blendvps(auVar82,auVar109,local_10c8);
          local_10d8 = local_12b8;
          uStack_10d0 = uStack_12b0;
          auVar52._8_4_ = valid.field_0.i[2];
          auVar52._0_8_ = valid.field_0._0_8_;
          auVar52._12_4_ = valid.field_0.i[3];
          auVar17._4_4_ = fVar79;
          auVar17._0_4_ = fVar76;
          auVar17._8_4_ = fVar121;
          auVar17._12_4_ = fVar165;
          auVar105 = blendvps(_DAT_01f45a30,auVar17,auVar52);
          auVar98._4_4_ = auVar105._0_4_;
          auVar98._0_4_ = auVar105._4_4_;
          auVar98._8_4_ = auVar105._12_4_;
          auVar98._12_4_ = auVar105._8_4_;
          auVar82 = minps(auVar98,auVar105);
          auVar53._0_8_ = auVar82._8_8_;
          auVar53._8_4_ = auVar82._0_4_;
          auVar53._12_4_ = auVar82._4_4_;
          auVar82 = minps(auVar53,auVar82);
          auVar54._0_8_ =
               CONCAT44(-(uint)(auVar82._4_4_ == auVar105._4_4_ && bVar22),
                        -(uint)(auVar82._0_4_ == auVar105._0_4_ && bVar21));
          auVar54._8_4_ = -(uint)(auVar82._8_4_ == auVar105._8_4_ && bVar20);
          auVar54._12_4_ = -(uint)(auVar82._12_4_ == auVar105._12_4_ && bVar19);
          iVar26 = movmskps((int)pSVar8,auVar54);
          aVar70 = valid.field_0;
          if (iVar26 != 0) {
            aVar70.i[2] = auVar54._8_4_;
            aVar70._0_8_ = auVar54._0_8_;
            aVar70.i[3] = auVar54._12_4_;
          }
          uVar27 = movmskps(iVar26,(undefined1  [16])aVar70);
          uVar31 = CONCAT44((int)((ulong)pSVar8 >> 0x20),uVar27);
          lVar30 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
LAB_006ffe2e:
          uVar40 = *(uint *)(lVar1 + 0xc0 + lVar30 * 4);
          pGVar9 = (pSVar8->geometries).items[uVar40].ptr;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_1278 + lVar30 * 4 + -0x10) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar27 = *(undefined4 *)(local_1128 + lVar30 * 4);
              uVar28 = *(undefined4 *)(local_1118 + lVar30 * 4);
              *(float *)(ray + k * 4 + 0x80) = local_1108[lVar30];
              *(float *)(ray + k * 4 + 0xc0) = local_10f8[lVar30];
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10e8 + lVar30 * 4);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_10d8 + lVar30 * 4);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar27;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar28;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_11b8 + lVar30 * 4)
              ;
              *(uint *)(ray + k * 4 + 0x120) = uVar40;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              uVar40 = context->user->instPrimID[0];
              puVar29 = (undefined1 *)(ulong)uVar40;
              *(uint *)(ray + k * 4 + 0x140) = uVar40;
              goto LAB_006ff656;
            }
            local_1058 = *(undefined4 *)(local_1128 + lVar30 * 4);
            local_1048 = *(undefined4 *)(local_1118 + lVar30 * 4);
            fVar66 = local_10f8[lVar30];
            uVar27 = *(undefined4 *)(local_10e8 + lVar30 * 4);
            local_1028._4_4_ = uVar40;
            local_1028._0_4_ = uVar40;
            local_1028._8_4_ = uVar40;
            local_1028._12_4_ = uVar40;
            uVar28 = *(undefined4 *)((long)&local_11b8 + lVar30 * 4);
            local_1038._4_4_ = uVar28;
            local_1038._0_4_ = uVar28;
            local_1038._8_4_ = uVar28;
            local_1038._12_4_ = uVar28;
            local_1088._4_4_ = fVar66;
            local_1088._0_4_ = fVar66;
            fStack_1080 = fVar66;
            fStack_107c = fVar66;
            local_1078._4_4_ = uVar27;
            local_1078._0_4_ = uVar27;
            local_1078._8_4_ = uVar27;
            local_1078._12_4_ = uVar27;
            uVar27 = *(undefined4 *)((long)&local_10d8 + lVar30 * 4);
            local_1068._4_4_ = uVar27;
            local_1068._0_4_ = uVar27;
            local_1068._8_4_ = uVar27;
            local_1068._12_4_ = uVar27;
            uStack_1054 = local_1058;
            uStack_1050 = local_1058;
            uStack_104c = local_1058;
            uStack_1044 = local_1048;
            uStack_1040 = local_1048;
            uStack_103c = local_1048;
            local_1018 = context->user->instID[0];
            uStack_1014 = local_1018;
            uStack_1010 = local_1018;
            uStack_100c = local_1018;
            local_1008 = context->user->instPrimID[0];
            uStack_1004 = local_1008;
            uStack_1000 = local_1008;
            uStack_ffc = local_1008;
            *(float *)(ray + k * 4 + 0x80) = local_1108[lVar30];
            local_1228 = *(undefined1 (*) [16])
                          (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
            args.valid = (int *)local_1228;
            args.geometryUserPtr = pGVar9->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)local_1088;
            args.N = 4;
            local_1218 = fVar76;
            fStack_1214 = fVar79;
            fStack_1210 = fVar121;
            fStack_120c = fVar165;
            local_1208 = lVar34;
            args.ray = (RTCRayN *)ray;
            if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar9->intersectionFilterN)(&args);
            }
            if (local_1228 == (undefined1  [16])0x0) {
              auVar71._8_4_ = 0xffffffff;
              auVar71._0_8_ = 0xffffffffffffffff;
              auVar71._12_4_ = 0xffffffff;
              auVar71 = auVar71 ^ _DAT_01f46b70;
            }
            else {
              p_Var10 = context->args->filter;
              if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var10)(&args);
              }
              auVar55._0_4_ = -(uint)(local_1228._0_4_ == 0);
              auVar55._4_4_ = -(uint)(local_1228._4_4_ == 0);
              auVar55._8_4_ = -(uint)(local_1228._8_4_ == 0);
              auVar55._12_4_ = -(uint)(local_1228._12_4_ == 0);
              auVar71 = auVar55 ^ _DAT_01f46b70;
              if (local_1228 != (undefined1  [16])0x0) {
                auVar82 = blendvps(*(undefined1 (*) [16])args.hit,
                                   *(undefined1 (*) [16])(args.ray + 0xc0),auVar55);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                   *(undefined1 (*) [16])(args.ray + 0xd0),auVar55);
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                   *(undefined1 (*) [16])(args.ray + 0xe0),auVar55);
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                   *(undefined1 (*) [16])(args.ray + 0xf0),auVar55);
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                   *(undefined1 (*) [16])(args.ray + 0x100),auVar55);
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                   *(undefined1 (*) [16])(args.ray + 0x110),auVar55);
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                   *(undefined1 (*) [16])(args.ray + 0x120),auVar55);
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                   *(undefined1 (*) [16])(args.ray + 0x130),auVar55);
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar82;
                auVar82 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                   *(undefined1 (*) [16])(args.ray + 0x140),auVar55);
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar82;
              }
            }
            if ((_DAT_01f46b40 & auVar71) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_1278._0_4_;
            }
            else {
              _local_1278 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_1278 + lVar30 * 4 + -0x10) = 0;
            valid.field_0.i[0] = -(uint)(local_1218 <= (float)local_1278._0_4_) & valid.field_0.i[0]
            ;
            valid.field_0.i[1] =
                 -(uint)(fStack_1214 <= (float)local_1278._0_4_) & valid.field_0.i[1];
            valid.field_0.i[2] =
                 -(uint)(fStack_1210 <= (float)local_1278._0_4_) & valid.field_0.i[2];
            valid.field_0.i[3] =
                 -(uint)(fStack_120c <= (float)local_1278._0_4_) & valid.field_0.i[3];
            lVar34 = local_1208;
            fVar76 = local_1218;
            fVar79 = fStack_1214;
            fVar121 = fStack_1210;
            fVar165 = fStack_120c;
            fVar166 = local_10a8;
            fVar112 = fStack_10a4;
            fVar61 = fStack_10a0;
            fVar64 = fStack_109c;
            iVar25 = local_10b8;
            iVar162 = iStack_10b4;
            iVar163 = iStack_10b0;
            iVar164 = iStack_10ac;
          }
          uVar27 = (undefined4)((ulong)lVar30 >> 0x20);
          iVar26 = movmskps((int)lVar30,(undefined1  [16])valid.field_0);
          puVar29 = (undefined1 *)CONCAT44(uVar27,iVar26);
          if (iVar26 == 0) goto LAB_006ff656;
          auVar18._4_4_ = fVar79;
          auVar18._0_4_ = fVar76;
          auVar18._8_4_ = fVar121;
          auVar18._12_4_ = fVar165;
          auVar105 = blendvps(_DAT_01f45a30,auVar18,(undefined1  [16])valid.field_0);
          auVar99._4_4_ = auVar105._0_4_;
          auVar99._0_4_ = auVar105._4_4_;
          auVar99._8_4_ = auVar105._12_4_;
          auVar99._12_4_ = auVar105._8_4_;
          auVar82 = minps(auVar99,auVar105);
          auVar72._0_8_ = auVar82._8_8_;
          auVar72._8_4_ = auVar82._0_4_;
          auVar72._12_4_ = auVar82._4_4_;
          auVar82 = minps(auVar72,auVar82);
          auVar73._0_8_ =
               CONCAT44(-(uint)(auVar82._4_4_ == auVar105._4_4_) & valid.field_0._4_4_,
                        -(uint)(auVar82._0_4_ == auVar105._0_4_) & valid.field_0._0_4_);
          auVar73._8_4_ = -(uint)(auVar82._8_4_ == auVar105._8_4_) & valid.field_0._8_4_;
          auVar73._12_4_ = -(uint)(auVar82._12_4_ == auVar105._12_4_) & valid.field_0._12_4_;
          iVar26 = movmskps(iVar26,auVar73);
          aVar56 = valid.field_0;
          if (iVar26 != 0) {
            aVar56.i[2] = auVar73._8_4_;
            aVar56._0_8_ = auVar73._0_8_;
            aVar56.i[3] = auVar73._12_4_;
          }
          uVar28 = movmskps(iVar26,(undefined1  [16])aVar56);
          uVar31 = CONCAT44(uVar27,uVar28);
          lVar30 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
          goto LAB_006ffe2e;
        }
      }
LAB_006ff656:
      fVar76 = local_fa8;
      fVar167 = fStack_fa4;
      fVar168 = fStack_fa0;
      fVar93 = fStack_f9c;
      fVar79 = local_fb8;
      fVar100 = fStack_fb4;
      fVar101 = fStack_fb0;
      fVar102 = fStack_fac;
      fVar121 = local_fc8;
      fVar103 = fStack_fc4;
      fVar110 = fStack_fc0;
      fVar111 = fStack_fbc;
      fVar66 = local_f98;
      fVar143 = fStack_f94;
      fVar146 = fStack_f90;
      fVar149 = fStack_f8c;
      fVar165 = local_fd8;
      fVar152 = fStack_fd4;
      fVar65 = fStack_fd0;
      fVar75 = fStack_fcc;
    }
    iVar26 = *(int *)(ray + k * 4 + 0x80);
    iVar74 = iVar26;
    iVar77 = iVar26;
    iVar78 = iVar26;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }